

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O0

bool __thiscall chipemu::implementation::nmos::get_node(nmos *this,uint id)

{
  uint uVar1;
  uint16_t *puVar2;
  uint16_t local_1c;
  uint id_local;
  nmos *this_local;
  
  if ((id != 0) && (uVar1 = node_count(this), id <= uVar1)) {
    local_1c = (uint16_t)id;
    puVar2 = node_addr(this,local_1c);
    return (*puVar2 & 4) != 0;
  }
  return false;
}

Assistant:

bool
nmos::get_node(unsigned id) const noexcept
{
    if (id > 0 and id <= node_count()) {
        return (*(node_addr(id))) & node_is_high;
    }
    else {
        return false;
    }
}